

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *atlas)

{
  int iVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  ImFontAtlasCustomRect *this;
  long in_RDI;
  int offset;
  int offset1;
  int offset0;
  int x;
  int n;
  int y;
  int w;
  ImFontAtlasCustomRect *r;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_20;
  int local_1c;
  int local_18;
  
  if (*(int *)(in_RDI + 0x70) < 0) {
    __assert_fail("atlas->CustomRectIds[0] >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x8d1,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if (*(long *)(in_RDI + 0x18) == 0) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x8d2,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  this = ImVector<ImFontAtlasCustomRect>::operator[]
                   ((ImVector<ImFontAtlasCustomRect> *)
                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (int)in_stack_ffffffffffffffcc);
  bVar2 = ImFontAtlasCustomRect::IsPacked(this);
  if (!bVar2) {
    __assert_fail("r.IsPacked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x8d4,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  iVar1 = *(int *)(in_RDI + 0x28);
  if ((*(uint *)(in_RDI + 4) & 2) == 0) {
    bVar2 = false;
    if (this->Width == 0xd9) {
      bVar2 = this->Height == 0x1b;
    }
    if (!bVar2) {
      __assert_fail("r.Width == FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF * 2 + 1 && r.Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0x8da,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    local_1c = 0;
    for (local_18 = 0; local_18 < 0x1b; local_18 = local_18 + 1) {
      for (local_20 = 0; local_20 < 0x6c; local_20 = local_20 + 1) {
        iVar4 = (uint)this->X + local_20 + ((uint)this->Y + local_18) * iVar1;
        uVar3 = 0;
        if ("..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
            [local_1c] == '.') {
          uVar3 = 0xff;
        }
        *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)iVar4) = uVar3;
        uVar3 = 0;
        if ("..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
            [local_1c] == 'X') {
          uVar3 = 0xff;
        }
        *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(iVar4 + 0x6d)) = uVar3;
        local_1c = local_1c + 1;
      }
    }
  }
  else {
    bVar2 = false;
    if (this->Width == 2) {
      bVar2 = this->Height == 2;
    }
    if (!bVar2) {
      __assert_fail("r.Width == 2 && r.Height == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0x8e6,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar4 = (uint)this->X + (uint)this->Y * iVar1;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(iVar4 + iVar1 + 1)) = 0xff;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(iVar4 + iVar1)) = 0xff;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(iVar4 + 1)) = 0xff;
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)iVar4) = 0xff;
  }
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffcc,
                 ((float)this->X + 0.5) * *(float *)(in_RDI + 0x30),
                 ((float)this->Y + 0.5) * *(float *)(in_RDI + 0x34));
  *(ulong *)(in_RDI + 0x38) = CONCAT44(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

static void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->CustomRectIds[0] >= 0);
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL);
    ImFontAtlasCustomRect& r = atlas->CustomRects[atlas->CustomRectIds[0]];
    IM_ASSERT(r.IsPacked());

    const int w = atlas->TexWidth;
    if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
    {
        // Render/copy pixels
        IM_ASSERT(r.Width == FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF * 2 + 1 && r.Height == FONT_ATLAS_DEFAULT_TEX_DATA_H);
        for (int y = 0, n = 0; y < FONT_ATLAS_DEFAULT_TEX_DATA_H; y++)
            for (int x = 0; x < FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF; x++, n++)
            {
                const int offset0 = (int)(r.X + x) + (int)(r.Y + y) * w;
                const int offset1 = offset0 + FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
                atlas->TexPixelsAlpha8[offset0] = FONT_ATLAS_DEFAULT_TEX_DATA_PIXELS[n] == '.' ? 0xFF : 0x00;
                atlas->TexPixelsAlpha8[offset1] = FONT_ATLAS_DEFAULT_TEX_DATA_PIXELS[n] == 'X' ? 0xFF : 0x00;
            }
    }
    else
    {
        IM_ASSERT(r.Width == 2 && r.Height == 2);
        const int offset = (int)(r.X) + (int)(r.Y) * w;
        atlas->TexPixelsAlpha8[offset] = atlas->TexPixelsAlpha8[offset + 1] = atlas->TexPixelsAlpha8[offset + w] = atlas->TexPixelsAlpha8[offset + w + 1] = 0xFF;
    }
    atlas->TexUvWhitePixel = ImVec2((r.X + 0.5f) * atlas->TexUvScale.x, (r.Y + 0.5f) * atlas->TexUvScale.y);
}